

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O1

void __thiscall lumeview::Renderer::render(Renderer *this,View *view)

{
  GLfloat GVar1;
  pointer pSVar2;
  PFNGLUNIFORM1FPROC p_Var3;
  PFNGLUNIFORM4FVPROC p_Var4;
  GLint GVar5;
  char *__to;
  Renderer *__from;
  pointer pSVar6;
  Shader shader;
  pointer local_48;
  pointer local_40;
  Renderer *local_38;
  
  prepare_buffers(this);
  (*glad_glEnable)(0xbe2);
  (*glad_glBlendFunc)(0x302,0x303);
  (*glad_glDepthFunc)(0x203);
  pSVar6 = (this->m_stages).
           super__Vector_base<lumeview::Renderer::Stage,_std::allocator<lumeview::Renderer::Stage>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (this->m_stages).
           super__Vector_base<lumeview::Renderer::Stage,_std::allocator<lumeview::Renderer::Stage>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar6 != pSVar2) {
    local_38 = this;
    do {
      __from = local_38;
      get_shader((Renderer *)&stack0xffffffffffffffb8,(GrobSet)(index_t)local_38,
                 (pSVar6->grobSet).m_offset);
      View::apply(view);
      if (*(char *)&(local_48->coordBuf).
                    super___shared_ptr<lumeview::GLBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          '\0') {
        Shader::link((Shader *)&stack0xffffffffffffffb8,(char *)__from,__to);
      }
      (*glad_glUseProgram)(*(GLuint *)&(local_48->name)._M_dataplus._M_p);
      Shader::set_view((Shader *)&stack0xffffffffffffffb8,view);
      p_Var4 = glad_glUniform4fv;
      GVar5 = (*glad_glGetUniformLocation)(*(GLuint *)&(local_48->name)._M_dataplus._M_p,"color");
      (*p_Var4)(GVar5,1,(GLfloat *)&pSVar6->color);
      p_Var3 = glad_glUniform1f;
      GVar1 = pSVar6->zfacNear;
      GVar5 = (*glad_glGetUniformLocation)(*(GLuint *)&(local_48->name)._M_dataplus._M_p,"zfacNear")
      ;
      (*p_Var3)(GVar5,GVar1);
      p_Var3 = glad_glUniform1f;
      GVar1 = pSVar6->zfacFar;
      GVar5 = (*glad_glGetUniformLocation)(*(GLuint *)&(local_48->name)._M_dataplus._M_p,"zfacFar");
      (*p_Var3)(GVar5,GVar1);
      (*glad_glBindVertexArray)(pSVar6->vao);
      (*glad_glDrawElements)(pSVar6->primType,pSVar6->numInds,0x1405,(void *)0x0);
      if (local_40 != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40);
      }
      pSVar6 = pSVar6 + 1;
    } while (pSVar6 != pSVar2);
  }
  return;
}

Assistant:

void Renderer::
render (const View& view)
{
	prepare_buffers ();

	glEnable (GL_BLEND);
	glBlendFunc (GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
	glDepthFunc(GL_LEQUAL);

	for(auto& stage : m_stages) {
		Shader shader = get_shader (stage.grobSet, stage.shadingPreset);
		view.apply ();
		shader.use ();
		shader.set_view (view);
		shader.set_uniform("color", stage.color);
		shader.set_uniform("zfacNear", stage.zfacNear);
		shader.set_uniform("zfacFar", stage.zfacFar);
		glBindVertexArray (stage.vao);
		glDrawElements (stage.primType, stage.numInds, GL_UNSIGNED_INT, 0);
	}
}